

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

HMODULE LoadLibraryExA(LPCSTR lpLibFileName,HANDLE hFile,DWORD dwFlags)

{
  bool bVar1;
  LPCSTR local_38;
  HMODULE hModule;
  LPSTR lpstr;
  DWORD dwFlags_local;
  HANDLE hFile_local;
  LPCSTR lpLibFileName_local;
  
  if (dwFlags == 0) {
    hModule = (HMODULE)0x0;
    local_38 = (LPCSTR)0x0;
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    bVar1 = LOADVerifyLibraryPath<char>(lpLibFileName);
    if (bVar1) {
      hModule = CorUnix::InternalStrdup(lpLibFileName);
      if ((char *)hModule == (char *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        SetLastError(8);
      }
      else {
        FILEDosToUnixPathA((LPSTR)hModule);
        local_38 = (LPCSTR)LOADLoadLibrary((LPCSTR)hModule,1);
      }
    }
    if (hModule != (HMODULE)0x0) {
      CorUnix::InternalFree(hModule);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpLibFileName_local = local_38;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","LoadLibraryExA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0xa3);
    fprintf(_stderr,"Needs Implementation!!!");
    lpLibFileName_local = (LPCSTR)0x0;
  }
  return lpLibFileName_local;
}

Assistant:

HMODULE
PALAPI
LoadLibraryExA(
    IN LPCSTR lpLibFileName,
    IN /*Reserved*/ HANDLE hFile,
    IN DWORD dwFlags)
{
    if (dwFlags != 0)
    {
        // UNIXTODO: Implement this!
        ASSERT("Needs Implementation!!!");
        return nullptr;
    }

    LPSTR lpstr = nullptr;
    HMODULE hModule = nullptr;

    PERF_ENTRY(LoadLibraryA);
    ENTRY("LoadLibraryExA (lpLibFileName=%p (%s)) \n",
          (lpLibFileName) ? lpLibFileName : "NULL",
          (lpLibFileName) ? lpLibFileName : "NULL");

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto Done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    lpstr = InternalStrdup(lpLibFileName);
    if (!lpstr)
    {
        ERROR("InternalStrdup failure!\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto Done;
    }
    FILEDosToUnixPathA(lpstr);

    hModule = LOADLoadLibrary(lpstr, TRUE);

    /* let LOADLoadLibrary call SetLastError */
 Done:
    if (lpstr != nullptr)
    {
        InternalFree(lpstr);
    }

    LOGEXIT("LoadLibraryExA returns HMODULE %p\n", hModule);
    PERF_EXIT(LoadLibraryExA);
    return hModule;

}